

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O1

void ui_wrap_text(wchar_t width,char *input,wchar_t *output_count,char ***output)

{
  ulong uVar1;
  byte bVar2;
  wchar_t wVar3;
  size_t sVar4;
  char **ppcVar5;
  long lVar6;
  ushort **ppuVar7;
  char *pcVar8;
  byte *pbVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  size_t __n;
  ulong uVar13;
  bool bVar14;
  
  sVar4 = strlen(input);
  ppcVar5 = (char **)malloc(0xa0);
  *output = ppcVar5;
  lVar6 = 0;
  do {
    (*output)[lVar6] = (char *)0x0;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x14);
  iVar12 = 0;
  uVar13 = 0;
  do {
    wVar3 = (int)sVar4 - iVar12;
    lVar6 = (long)iVar12;
    if (width < wVar3) {
      ppuVar7 = __ctype_b_loc();
      iVar11 = width + L'\x01' + iVar12;
      lVar10 = (long)(width + iVar12);
      do {
        pbVar9 = (byte *)(input + lVar10);
        iVar11 = iVar11 + -1;
        if (((*ppuVar7)[*pbVar9] >> 0xd & 1) != 0) break;
        bVar14 = lVar6 + 0x14 < lVar10;
        lVar10 = lVar10 + -1;
      } while (bVar14);
      if (((*ppuVar7)[*pbVar9] >> 0xd & 1) == 0) {
        iVar11 = width + iVar12;
      }
      __n = (size_t)(iVar11 - iVar12);
      pcVar8 = (char *)malloc(__n + 1);
      strncpy(pcVar8,input + lVar6,__n);
      pcVar8[__n] = '\0';
      (*output)[uVar13] = pcVar8;
      iVar12 = iVar11 + -1;
      pbVar9 = (byte *)(input + iVar11);
      do {
        bVar2 = *pbVar9;
        iVar12 = iVar12 + 1;
        pbVar9 = pbVar9 + 1;
      } while ((*(byte *)((long)*ppuVar7 + (ulong)bVar2 * 2 + 1) & 0x20) != 0);
    }
    else {
      pcVar8 = strdup(input + lVar6);
      (*output)[uVar13] = pcVar8;
    }
    uVar1 = uVar13 + 1;
    if (((wVar3 <= width) || (input[iVar12] == '\0')) ||
       (bVar14 = 0x12 < uVar13, uVar13 = uVar1, bVar14)) {
      *output_count = (wchar_t)uVar1;
      return;
    }
  } while( true );
}

Assistant:

void ui_wrap_text(int width, const char *input, int *output_count, char ***output)
{
    const int min_width = 20, max_wrap = 20;

    int len = strlen(input);
    int input_idx, input_lidx;
    int idx, outcount;

    *output = malloc(max_wrap * sizeof(char *));
    for (idx = 0; idx < max_wrap; idx++)
	(*output)[idx] = NULL;

    input_idx = 0;
    outcount = 0;
    do {
	size_t outsize;
	char *outbuf;

	if (len - input_idx <= width) {
	    /* enough room for the rest of the input */
	    (*output)[outcount] = strdup(input + input_idx);
	    outcount++;
	    break;
	}

	/* find nearest space in input to right edge that doesn't exceed width */
	input_lidx = input_idx + width;
	while (!isspace((unsigned char)input[input_lidx]) &&
	       input_lidx - input_idx > min_width)
	    input_lidx--;
	/* didn't find a space, so just go with width-worth of characters */
	if (!isspace((unsigned char)input[input_lidx]))
	    input_lidx = input_idx + width;

	outsize = input_lidx - input_idx;
	outbuf = malloc(outsize + 1);
	strncpy(outbuf, input + input_idx, outsize);
	outbuf[outsize] = '\0';
	(*output)[outcount] = outbuf;
	outcount++;

	/* skip extra spaces in break */
	input_idx = input_lidx;
	while (isspace((unsigned char)input[input_idx]))
	    input_idx++;
    } while (input[input_idx] && outcount < max_wrap);

    *output_count = outcount;
}